

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_misc.c
# Opt level: O2

HTS_File * HTS_fopen_from_fp(HTS_File *fp,size_t size)

{
  long *plVar1;
  long lVar2;
  undefined8 *__ptr;
  void *pvVar3;
  size_t sVar4;
  HTS_File *pHVar5;
  
  if (size != 0 && fp != (HTS_File *)0x0) {
    if (fp->type == '\x01') {
      plVar1 = (long *)fp->pointer;
      if (plVar1[2] + size <= (ulong)plVar1[1]) {
        __ptr = (undefined8 *)HTS_calloc(1,0x18);
        pvVar3 = HTS_calloc(size,1);
        *__ptr = pvVar3;
        __ptr[1] = size;
        __ptr[2] = 0;
        lVar2 = plVar1[2];
        memcpy(pvVar3,(void *)(*plVar1 + lVar2),size);
        plVar1[2] = lVar2 + size;
        goto LAB_0010361f;
      }
    }
    else {
      if (fp->type != '\0') {
        HTS_error(0,"HTS_fopen_from_fp: Unknown file type.\n");
        return (HTS_File *)0x0;
      }
      __ptr = (undefined8 *)HTS_calloc(1,0x18);
      pvVar3 = HTS_calloc(size,1);
      *__ptr = pvVar3;
      __ptr[1] = size;
      __ptr[2] = 0;
      sVar4 = fread(pvVar3,1,size,(FILE *)fp->pointer);
      if (sVar4 == size) {
LAB_0010361f:
        pHVar5 = (HTS_File *)HTS_calloc(1,0x10);
        pHVar5->type = '\x01';
        pHVar5->pointer = __ptr;
        return pHVar5;
      }
      free(pvVar3);
      free(__ptr);
    }
  }
  return (HTS_File *)0x0;
}

Assistant:

HTS_File *HTS_fopen_from_fp(HTS_File * fp, size_t size)
{
   if (fp == NULL || size == 0)
      return NULL;
   else if (fp->type == HTS_FILE) {
      HTS_Data *d;
      HTS_File *f;
      d = (HTS_Data *) HTS_calloc(1, sizeof(HTS_Data));
      d->data = (unsigned char *) HTS_calloc(size, sizeof(unsigned char));
      d->size = size;
      d->index = 0;
      if (fread(d->data, sizeof(unsigned char), size, (FILE *) fp->pointer) != size) {
         free(d->data);
         free(d);
         return NULL;
      }
      f = (HTS_File *) HTS_calloc(1, sizeof(HTS_File));
      f->type = HTS_DATA;
      f->pointer = (void *) d;
      return f;
   } else if (fp->type == HTS_DATA) {
      HTS_File *f;
      HTS_Data *tmp1, *tmp2;
      tmp1 = (HTS_Data *) fp->pointer;
      if (tmp1->index + size > tmp1->size)
         return NULL;
      tmp2 = (HTS_Data *) HTS_calloc(1, sizeof(HTS_Data));
      tmp2->data = (unsigned char *) HTS_calloc(size, sizeof(unsigned char));
      tmp2->size = size;
      tmp2->index = 0;
      memcpy(tmp2->data, &tmp1->data[tmp1->index], size);
      tmp1->index += size;
      f = (HTS_File *) HTS_calloc(1, sizeof(HTS_File));
      f->type = HTS_DATA;
      f->pointer = (void *) tmp2;
      return f;
   }

   HTS_error(0, "HTS_fopen_from_fp: Unknown file type.\n");
   return NULL;
}